

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

char * CVmObjString::find_substr
                 (vm_val_t *strval,char *basestr,char *str,size_t len,char *substr,
                 CVmObjPattern *pat,int *match_idx,int *match_len)

{
  ushort uVar1;
  re_compiled_pattern *pattern;
  vm_globalvar_t *pvVar2;
  CRegexSearcherSimple *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  CVmBifTADSGlobals *pCVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  byte *__s1;
  bool bVar11;
  
  if (substr == (char *)0x0) {
    if (pat != (CVmObjPattern *)0x0) {
      pattern = *(re_compiled_pattern **)(pat->super_CVmObject).ext_;
      pvVar2 = G_bif_tads_globals_X->last_rex_str;
      uVar5 = *(undefined4 *)&strval->field_0x4;
      aVar4 = strval->val;
      (pvVar2->val).typ = strval->typ;
      *(undefined4 *)&(pvVar2->val).field_0x4 = uVar5;
      (pvVar2->val).val = aVar4;
      pCVar6 = G_bif_tads_globals_X;
      pCVar3 = G_bif_tads_globals_X->rex_searcher;
      *(undefined4 *)&pCVar3->field_0x64 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x68 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x6c = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x70 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x54 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x58 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x5c = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x60 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x44 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x48 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x4c = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x50 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x34 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x38 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x3c = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x40 = 0xffffffff;
      *(undefined4 *)&(pCVar3->super_CRegexSearcher).field_0x24 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x28 = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x2c = 0xffffffff;
      *(undefined4 *)&pCVar3->field_0x30 = 0xffffffff;
      (pCVar3->match_).start_ofs = -1;
      (pCVar3->match_).end_ofs = -1;
      pbVar9 = (byte *)str;
      uVar8 = CRegexSearcherSimple::search_for_pattern
                        (pCVar6->rex_searcher,pattern,basestr,str,len,match_len);
      if (-1 < (int)uVar8) {
        pbVar9 = (byte *)(str + uVar8);
        iVar7 = 0;
        if (uVar8 != 0) {
          do {
            str = (char *)((byte *)str +
                          (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) +
                          1);
            iVar7 = iVar7 + 1;
          } while (str < pbVar9);
        }
        *match_idx = iVar7;
      }
      if (-1 < (int)uVar8) {
        return (char *)pbVar9;
      }
    }
  }
  else {
    uVar1 = *(ushort *)substr;
    pbVar9 = (byte *)(ulong)uVar1;
    bVar11 = len < pbVar9;
    if (pbVar9 <= len) {
      iVar7 = bcmp(str,substr + 2,(size_t)pbVar9);
      iVar10 = 0;
      while (iVar7 != 0) {
        __s1 = (byte *)str +
               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
        len = (size_t)((byte *)str + (len - (long)__s1));
        bVar11 = len < pbVar9;
        if (bVar11) goto LAB_0028b88e;
        iVar10 = iVar10 + 1;
        iVar7 = bcmp(__s1,substr + 2,(size_t)pbVar9);
        str = (char *)__s1;
      }
      *match_idx = iVar10;
      *match_len = (uint)uVar1;
      if (!bVar11) {
        return (char *)(byte *)str;
      }
    }
  }
LAB_0028b88e:
  *match_idx = -1;
  *match_len = 0;
  return (char *)0x0;
}

Assistant:

const char *CVmObjString::find_substr(
    VMG_ const vm_val_t *strval,
    const char *basestr, const char *str, size_t len,
    const char *substr, CVmObjPattern *pat, int *match_idx, int *match_len)
{
    /* search for the string or pattern */
    if (substr != 0)
    {
        /* get the substring length and buffer pointer */
        size_t sublen = vmb_get_len(substr);
        substr += VMB_LEN;

        /* search for the substring */
        utf8_ptr p((char *)str);
        for (int i = 0 ; len >= sublen ; p.inc(&len), ++i)
        {
            /* check for a match */
            if (memcmp(p.getptr(), substr, sublen) == 0)
            {
                /* got it - the match length is simply the substring length */
                *match_idx = i;
                *match_len = sublen;
                return p.getptr();
            }
        }
    }
    else if (pat != 0)
    {
        /* get the compiled pattern */
        re_compiled_pattern *cpat = pat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *strval;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* search for the pattern */
        int idx = G_bif_tads_globals->rex_searcher->search_for_pattern(
            cpat, basestr, str, len, match_len);

        /* if we found the match, return it */
        if (idx >= 0)
        {
            /* set the match index and length */
            *match_idx = utf8_ptr::s_len(str, idx);
            return str + idx;
        }
    }

    /* no match */
    *match_idx = -1;
    *match_len = 0;
    return 0;
}